

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void icetCompressedSubComposite
               (IceTImage destBuffer,IceTSizeType offset,IceTSparseImage srcBuffer,int srcOnTop)

{
  float *pfVar1;
  byte bVar2;
  IceTFloat IVar3;
  int iVar4;
  IceTFloat *pIVar5;
  IceTUByte *pIVar6;
  IceTFloat *pIVar7;
  int iVar8;
  char *file;
  int iVar9;
  int iVar10;
  IceTBitField level;
  float *pfVar11;
  IceTVoid *_runlengths;
  int *piVar12;
  float *pfVar13;
  IceTFloat *pIVar14;
  ushort uVar15;
  IceTEnum type;
  char *msg;
  float fVar16;
  IceTFloat IVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  float fVar23;
  IceTEnum _composite_mode;
  IceTUInt _background_color;
  
  icetTimingBlendBegin();
  lVar20 = (long)offset;
  if (srcOnTop == 0) {
    icetGetEnumv(0x28,&_composite_mode);
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar10 = 0xd000;
      iVar8 = 0xc000;
      iVar4 = 0;
      iVar9 = 0;
      if (destBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_00111b06;
LAB_00111b38:
      if (iVar9 - offset < iVar4) goto LAB_00111b3e;
    }
    else {
      iVar8 = *(int *)((long)srcBuffer.opaque_internals + 4);
      iVar10 = *(int *)((long)srcBuffer.opaque_internals + 8);
      iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
              *(int *)((long)srcBuffer.opaque_internals + 0xc);
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        if ((iVar8 == 0xc000) && (iVar8 = 0xc000, iVar10 == 0xd000)) {
          iVar10 = 0xd000;
          bVar22 = true;
LAB_00111b1e:
          iVar9 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                  *(int *)((long)srcBuffer.opaque_internals + 0xc);
LAB_00111b25:
          if (iVar4 == iVar9) {
            iVar9 = 0;
            if (!bVar22) {
              iVar9 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
                      *(int *)((long)destBuffer.opaque_internals + 0xc);
            }
            goto LAB_00111b38;
          }
        }
      }
      else {
LAB_00111b06:
        if ((iVar8 == *(int *)((long)destBuffer.opaque_internals + 4)) &&
           (iVar10 == *(int *)((long)destBuffer.opaque_internals + 8))) {
          bVar22 = false;
          iVar9 = 0;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_00111b1e;
          goto LAB_00111b25;
        }
      }
LAB_00111b3e:
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if (_composite_mode == 0x302) {
      if (iVar10 != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (iVar8 == 0xc000) goto LAB_00111e22;
      if (iVar8 == 0xc002) {
        pIVar5 = icetImageGetColorcf(destBuffer);
        icetGetFloatv(5,(IceTFloat *)&_background_color);
        iVar8 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                  *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        pfVar11 = (float *)(pIVar5 + (offset << 2));
        pfVar13 = (float *)((long)srcBuffer.opaque_internals + 0x1c);
        iVar10 = 0x3a;
        iVar4 = 0;
        while (iVar4 < iVar8) {
          iVar4 = iVar4 + (int)*pfVar13;
          if (iVar8 < iVar4) goto LAB_001122a1;
          fVar16 = pfVar13[1];
          iVar4 = iVar4 + (int)fVar16;
          if (iVar8 < iVar4) goto LAB_0011229e;
          pfVar11 = pfVar11 + (long)(int)*pfVar13 * 4;
          pfVar13 = pfVar13 + 2;
          if ((int)fVar16 < 1) {
            fVar16 = 0.0;
          }
          while (bVar22 = fVar16 != 0.0, fVar16 = (float)((int)fVar16 + -1), bVar22) {
            fVar23 = 1.0 - pfVar11[3];
            *pfVar11 = *pfVar13 * fVar23 + *pfVar11;
            pfVar11[1] = pfVar13[1] * fVar23 + pfVar11[1];
            pfVar11[2] = pfVar13[2] * fVar23 + pfVar11[2];
            pfVar1 = pfVar13 + 3;
            pfVar13 = pfVar13 + 4;
            pfVar11[3] = fVar23 * *pfVar1 + pfVar11[3];
            pfVar11 = pfVar11 + 4;
          }
        }
        goto LAB_001122ba;
      }
      if (iVar8 == 0xc001) {
        pIVar6 = icetImageGetColorcub(destBuffer);
        icetGetIntegerv(6,(IceTInt *)&_background_color);
        iVar8 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                  *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        pIVar6 = pIVar6 + lVar20 * 4;
        piVar12 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
        iVar10 = 0x3a;
        iVar4 = 0;
        while (iVar4 < iVar8) {
          iVar9 = *piVar12;
          if (iVar8 < iVar4 + iVar9) goto LAB_001122a1;
          iVar21 = piVar12[1];
          iVar4 = iVar4 + iVar9 + iVar21;
          if (iVar8 < iVar4) goto LAB_0011203e;
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          lVar18 = 0;
          for (lVar20 = 0; iVar21 != (int)lVar20; lVar20 = lVar20 + 1) {
            bVar2 = pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 3];
            uVar15 = bVar2 ^ 0xff;
            pIVar6[lVar20 * 4 + (long)iVar9 * 4] =
                 pIVar6[lVar20 * 4 + (long)iVar9 * 4] +
                 (char)((ushort)(*(byte *)(piVar12 + lVar20 + 2) * uVar15) / 0xff);
            pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 1] =
                 pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 1] +
                 (char)((ushort)(*(byte *)((long)piVar12 + lVar20 * 4 + 9) * uVar15) / 0xff);
            pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 2] =
                 pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 2] +
                 (char)((ushort)(*(byte *)((long)piVar12 + lVar20 * 4 + 10) * uVar15) / 0xff);
            pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 3] =
                 (char)((ushort)(*(byte *)((long)piVar12 + lVar20 * 4 + 0xb) * uVar15) / 0xff) +
                 bVar2;
            lVar18 = lVar18 + -4;
          }
          pIVar6 = pIVar6 + ((long)iVar9 * 4 - lVar18);
          piVar12 = (int *)((long)piVar12 + (8 - lVar18));
        }
        goto LAB_001122ba;
      }
LAB_00111e41:
      msg = "Encountered invalid color format.";
      file = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xffffffff;
      level = 1;
      iVar10 = 0x142;
    }
    else {
      if (_composite_mode != 0x301) goto LAB_00111c78;
      if (iVar10 == 0xd000) goto LAB_00111de4;
      if (iVar10 != 0xd001) goto LAB_00111e03;
      pIVar5 = icetImageGetDepthcf(destBuffer);
      pIVar5 = pIVar5 + lVar20;
      if (iVar8 == 0xc000) {
        iVar8 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                  *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        piVar12 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
        iVar10 = 0;
        while (iVar10 < iVar8) {
          iVar4 = *piVar12;
          if (iVar8 < iVar10 + iVar4) goto LAB_0011233c;
          iVar9 = piVar12[1];
          iVar10 = iVar10 + iVar4 + iVar9;
          if (iVar8 < iVar10) goto LAB_00112354;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          lVar20 = 0;
          for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
            if ((float)piVar12[lVar18 + 2] < (float)pIVar5[iVar4 + lVar18]) {
              pIVar5[iVar4 + lVar18] = (IceTFloat)piVar12[lVar18 + 2];
            }
            lVar20 = lVar20 + -4;
          }
          pIVar5 = (IceTFloat *)((long)pIVar5 + ((long)iVar4 * 4 - lVar20));
          piVar12 = (int *)((long)piVar12 + (8 - lVar20));
        }
        goto LAB_001122ba;
      }
      if (iVar8 == 0xc002) {
        pIVar7 = icetImageGetColorcf(destBuffer);
        icetGetFloatv(5,(IceTFloat *)&_background_color);
        iVar8 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                  *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        pIVar7 = pIVar7 + (offset << 2);
        pIVar14 = (IceTFloat *)((long)srcBuffer.opaque_internals + 0x1c);
        iVar10 = 0x3a;
        iVar4 = 0;
        while (iVar4 < iVar8) {
          IVar3 = *pIVar14;
          if (iVar8 < iVar4 + (int)IVar3) goto LAB_001122a1;
          IVar17 = pIVar14[1];
          iVar4 = iVar4 + (int)IVar3 + (int)IVar17;
          if (iVar8 < iVar4) goto LAB_0011229e;
          pIVar14 = pIVar14 + 2;
          if ((int)IVar17 < 1) {
            IVar17 = 0.0;
          }
          lVar20 = 0;
          lVar18 = 0;
          while (bVar22 = IVar17 != 0.0, IVar17 = (IceTFloat)((int)IVar17 + -1), bVar22) {
            fVar16 = *(float *)((long)pIVar5 + lVar18 + (long)(int)IVar3 * 4);
            if ((float)pIVar14[4] <= fVar16 && fVar16 != (float)pIVar14[4]) {
              pIVar7[(int)IVar3 * 4 + lVar18] = *pIVar14;
              pIVar7[(long)((int)IVar3 * 4) + lVar18 + 1] = pIVar14[1];
              pIVar7[(long)((int)IVar3 * 4) + lVar18 + 2] = pIVar14[2];
              pIVar7[(long)((int)IVar3 * 4) + lVar18 + 3] = pIVar14[3];
              *(IceTFloat *)((long)pIVar5 + lVar18 + (long)(int)IVar3 * 4) = pIVar14[4];
            }
            pIVar14 = pIVar14 + 5;
            lVar18 = lVar18 + 4;
            lVar20 = lVar20 + -0x10;
          }
          pIVar5 = (IceTFloat *)((long)pIVar5 + lVar18 + (long)(int)IVar3 * 4);
          pIVar7 = (IceTFloat *)((long)pIVar7 + ((long)((int)IVar3 * 4) * 4 - lVar20));
        }
        goto LAB_001122ba;
      }
      if (iVar8 == 0xc001) {
        pIVar6 = icetImageGetColorcub(destBuffer);
        icetGetIntegerv(6,(IceTInt *)&_background_color);
        iVar8 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                  *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        pIVar6 = pIVar6 + lVar20 * 4;
        piVar12 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
        iVar10 = 0x3a;
        iVar4 = 0;
        while (iVar4 < iVar8) {
          lVar20 = (long)*piVar12;
          iVar4 = iVar4 + *piVar12;
          if (iVar8 < iVar4) goto LAB_001122a1;
          iVar9 = piVar12[1];
          iVar4 = iVar4 + iVar9;
          if (iVar8 < iVar4) goto LAB_0011229e;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          lVar18 = 0;
          lVar19 = 0;
          while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
            fVar16 = *(float *)((long)piVar12 + lVar19 * 2 + 0xc);
            if (fVar16 < *(float *)((long)pIVar5 + lVar19 + lVar20 * 4)) {
              *(undefined4 *)(pIVar6 + lVar19 + lVar20 * 4) =
                   *(undefined4 *)((long)piVar12 + lVar19 * 2 + 8);
              *(float *)((long)pIVar5 + lVar19 + lVar20 * 4) = fVar16;
            }
            lVar19 = lVar19 + 4;
            lVar18 = lVar18 + -8;
          }
          pIVar5 = (IceTFloat *)((long)pIVar5 + lVar19 + lVar20 * 4);
          pIVar6 = pIVar6 + lVar19 + lVar20 * 4;
          piVar12 = (int *)((long)piVar12 + (8 - lVar18));
        }
        goto LAB_001122ba;
      }
LAB_0011201f:
      msg = "Encountered invalid color format.";
      file = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xffffffff;
      level = 1;
      iVar10 = 0xe2;
    }
  }
  else {
    icetGetEnumv(0x28,&_composite_mode);
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar10 = 0xd000;
      iVar8 = 0xc000;
      iVar4 = 0;
      iVar9 = 0;
      if (destBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_00111827;
LAB_00111859:
      if (iVar9 - offset < iVar4) goto LAB_0011185f;
    }
    else {
      iVar8 = *(int *)((long)srcBuffer.opaque_internals + 4);
      iVar10 = *(int *)((long)srcBuffer.opaque_internals + 8);
      iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
              *(int *)((long)srcBuffer.opaque_internals + 0xc);
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        if ((iVar8 == 0xc000) && (iVar8 = 0xc000, iVar10 == 0xd000)) {
          iVar10 = 0xd000;
          bVar22 = true;
LAB_0011183f:
          iVar9 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                  *(int *)((long)srcBuffer.opaque_internals + 0xc);
LAB_00111846:
          if (iVar4 == iVar9) {
            iVar9 = 0;
            if (!bVar22) {
              iVar9 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
                      *(int *)((long)destBuffer.opaque_internals + 0xc);
            }
            goto LAB_00111859;
          }
        }
      }
      else {
LAB_00111827:
        if ((iVar8 == *(int *)((long)destBuffer.opaque_internals + 4)) &&
           (iVar10 == *(int *)((long)destBuffer.opaque_internals + 8))) {
          bVar22 = false;
          iVar9 = 0;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_0011183f;
          goto LAB_00111846;
        }
      }
LAB_0011185f:
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if (_composite_mode == 0x302) {
      if (iVar10 != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (iVar8 != 0xc000) {
        if (iVar8 == 0xc002) {
          pIVar5 = icetImageGetColorcf(destBuffer);
          icetGetFloatv(5,(IceTFloat *)&_background_color);
          iVar8 = 0;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
            iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                    *(int *)((long)srcBuffer.opaque_internals + 0xc);
          }
          pfVar11 = (float *)(pIVar5 + (offset << 2));
          pfVar13 = (float *)((long)srcBuffer.opaque_internals + 0x1c);
          iVar10 = 0x3a;
          iVar4 = 0;
          while (iVar4 < iVar8) {
            iVar4 = iVar4 + (int)*pfVar13;
            if (iVar8 < iVar4) goto LAB_001122a1;
            fVar16 = pfVar13[1];
            iVar4 = iVar4 + (int)fVar16;
            if (iVar8 < iVar4) goto LAB_0011229e;
            pfVar11 = pfVar11 + (long)(int)*pfVar13 * 4;
            pfVar13 = pfVar13 + 2;
            if ((int)fVar16 < 1) {
              fVar16 = 0.0;
            }
            while (bVar22 = fVar16 != 0.0, fVar16 = (float)((int)fVar16 + -1), bVar22) {
              fVar23 = 1.0 - pfVar13[3];
              *pfVar11 = *pfVar11 * fVar23 + *pfVar13;
              pfVar11[1] = pfVar11[1] * fVar23 + pfVar13[1];
              pfVar11[2] = pfVar11[2] * fVar23 + pfVar13[2];
              pfVar1 = pfVar13 + 3;
              pfVar13 = pfVar13 + 4;
              pfVar11[3] = fVar23 * pfVar11[3] + *pfVar1;
              pfVar11 = pfVar11 + 4;
            }
          }
          goto LAB_001122ba;
        }
        if (iVar8 == 0xc001) {
          pIVar6 = icetImageGetColorcub(destBuffer);
          icetGetIntegerv(6,(IceTInt *)&_background_color);
          iVar8 = 0;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
            iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                    *(int *)((long)srcBuffer.opaque_internals + 0xc);
          }
          pIVar6 = pIVar6 + lVar20 * 4;
          piVar12 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
          iVar10 = 0x3a;
          iVar4 = 0;
          while (iVar4 < iVar8) {
            iVar9 = *piVar12;
            if (iVar8 < iVar4 + iVar9) goto LAB_001122a1;
            iVar21 = piVar12[1];
            iVar4 = iVar4 + iVar9 + iVar21;
            if (iVar8 < iVar4) goto LAB_0011203e;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            lVar18 = 0;
            for (lVar20 = 0; iVar21 != (int)lVar20; lVar20 = lVar20 + 1) {
              uVar15 = *(byte *)((long)piVar12 + lVar20 * 4 + 0xb) ^ 0xff;
              pIVar6[lVar20 * 4 + (long)iVar9 * 4] =
                   (char)((ushort)(pIVar6[lVar20 * 4 + (long)iVar9 * 4] * uVar15) / 0xff) +
                   (char)piVar12[lVar20 + 2];
              pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 1] =
                   (char)((ushort)(pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 1] * uVar15) / 0xff) +
                   *(char *)((long)piVar12 + lVar20 * 4 + 9);
              pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 2] =
                   (char)((ushort)(pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 2] * uVar15) / 0xff) +
                   *(char *)((long)piVar12 + lVar20 * 4 + 10);
              pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 3] =
                   (char)((ushort)(pIVar6[lVar20 * 4 + (long)iVar9 * 4 + 3] * uVar15) / 0xff) +
                   *(char *)((long)piVar12 + lVar20 * 4 + 0xb);
              lVar18 = lVar18 + -4;
            }
            piVar12 = (int *)((long)piVar12 + (8 - lVar18));
            pIVar6 = pIVar6 + ((long)iVar9 * 4 - lVar18);
          }
          goto LAB_001122ba;
        }
        goto LAB_00111e41;
      }
LAB_00111e22:
      msg = "Decompressing image with no data.";
      file = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xfffffffb;
      level = 3;
      iVar10 = 0x13f;
    }
    else if (_composite_mode == 0x301) {
      if (iVar10 == 0xd000) {
LAB_00111de4:
        msg = "Cannot use Z buffer compositing operation with no Z buffer.";
        file = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
        ;
        type = 0xfffffffb;
        level = 1;
        iVar10 = 0xe6;
      }
      else {
        if (iVar10 == 0xd001) {
          pIVar5 = icetImageGetDepthcf(destBuffer);
          pIVar5 = pIVar5 + lVar20;
          if (iVar8 == 0xc000) {
            iVar8 = 0;
            if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
              iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc);
            }
            piVar12 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar10 = 0;
            while (iVar10 < iVar8) {
              iVar4 = *piVar12;
              if (iVar8 < iVar10 + iVar4) goto LAB_0011233c;
              iVar9 = piVar12[1];
              iVar10 = iVar10 + iVar4 + iVar9;
              if (iVar8 < iVar10) goto LAB_00112354;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              lVar20 = 0;
              for (lVar18 = 0; iVar9 != (int)lVar18; lVar18 = lVar18 + 1) {
                if ((float)piVar12[lVar18 + 2] < (float)pIVar5[iVar4 + lVar18]) {
                  pIVar5[iVar4 + lVar18] = (IceTFloat)piVar12[lVar18 + 2];
                }
                lVar20 = lVar20 + -4;
              }
              piVar12 = (int *)((long)piVar12 + (8 - lVar20));
              pIVar5 = (IceTFloat *)((long)pIVar5 + ((long)iVar4 * 4 - lVar20));
            }
            goto LAB_001122ba;
          }
          if (iVar8 == 0xc002) {
            pIVar7 = icetImageGetColorcf(destBuffer);
            icetGetFloatv(5,(IceTFloat *)&_background_color);
            iVar8 = 0;
            if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
              iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc);
            }
            pIVar7 = pIVar7 + (offset << 2);
            pIVar14 = (IceTFloat *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar10 = 0x3a;
            iVar4 = 0;
            while (iVar4 < iVar8) {
              IVar3 = *pIVar14;
              if (iVar8 < iVar4 + (int)IVar3) goto LAB_001122a1;
              IVar17 = pIVar14[1];
              iVar4 = iVar4 + (int)IVar3 + (int)IVar17;
              if (iVar8 < iVar4) goto LAB_0011229e;
              pIVar14 = pIVar14 + 2;
              if ((int)IVar17 < 1) {
                IVar17 = 0.0;
              }
              lVar20 = 0;
              lVar18 = 0;
              while (bVar22 = IVar17 != 0.0, IVar17 = (IceTFloat)((int)IVar17 + -1), bVar22) {
                fVar16 = *(float *)((long)pIVar5 + lVar20 + (long)(int)IVar3 * 4);
                if ((float)pIVar14[4] <= fVar16 && fVar16 != (float)pIVar14[4]) {
                  pIVar7[(int)IVar3 * 4 + lVar20] = *pIVar14;
                  pIVar7[(long)((int)IVar3 * 4) + lVar20 + 1] = pIVar14[1];
                  pIVar7[(long)((int)IVar3 * 4) + lVar20 + 2] = pIVar14[2];
                  pIVar7[(long)((int)IVar3 * 4) + lVar20 + 3] = pIVar14[3];
                  *(IceTFloat *)((long)pIVar5 + lVar20 + (long)(int)IVar3 * 4) = pIVar14[4];
                }
                pIVar14 = pIVar14 + 5;
                lVar18 = lVar18 + -0x10;
                lVar20 = lVar20 + 4;
              }
              pIVar7 = (IceTFloat *)((long)pIVar7 + ((long)((int)IVar3 * 4) * 4 - lVar18));
              pIVar5 = (IceTFloat *)((long)pIVar5 + lVar20 + (long)(int)IVar3 * 4);
            }
            goto LAB_001122ba;
          }
          if (iVar8 == 0xc001) {
            pIVar6 = icetImageGetColorcub(destBuffer);
            icetGetIntegerv(6,(IceTInt *)&_background_color);
            iVar8 = 0;
            if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
              iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                      *(int *)((long)srcBuffer.opaque_internals + 0xc);
            }
            pIVar6 = pIVar6 + lVar20 * 4;
            piVar12 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            iVar10 = 0x3a;
            iVar4 = 0;
            while (iVar4 < iVar8) {
              lVar20 = (long)*piVar12;
              iVar4 = iVar4 + *piVar12;
              if (iVar8 < iVar4) goto LAB_001122a1;
              iVar9 = piVar12[1];
              iVar4 = iVar4 + iVar9;
              if (iVar8 < iVar4) goto LAB_0011229e;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              lVar19 = 0;
              lVar18 = 0;
              while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
                fVar16 = *(float *)((long)piVar12 + lVar18 * 2 + 0xc);
                if (fVar16 < *(float *)((long)pIVar5 + lVar18 + lVar20 * 4)) {
                  *(undefined4 *)(pIVar6 + lVar18 + lVar20 * 4) =
                       *(undefined4 *)((long)piVar12 + lVar18 * 2 + 8);
                  *(float *)((long)pIVar5 + lVar18 + lVar20 * 4) = fVar16;
                }
                lVar18 = lVar18 + 4;
                lVar19 = lVar19 + -8;
              }
              piVar12 = (int *)((long)piVar12 + (8 - lVar19));
              pIVar6 = pIVar6 + lVar18 + lVar20 * 4;
              pIVar5 = (IceTFloat *)((long)pIVar5 + lVar18 + lVar20 * 4);
            }
            goto LAB_001122ba;
          }
          goto LAB_0011201f;
        }
LAB_00111e03:
        msg = "Encountered invalid depth format.";
        file = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
        ;
        type = 0xffffffff;
        level = 1;
        iVar10 = 0xe9;
      }
    }
    else {
LAB_00111c78:
      msg = "Encountered invalid composite mode.";
      file = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
      ;
      type = 0xffffffff;
      level = 1;
      iVar10 = 0x146;
    }
  }
  goto LAB_001122b5;
LAB_0011203e:
  iVar10 = 0x43;
  goto LAB_001122a1;
LAB_0011233c:
  iVar10 = 0x3a;
  goto LAB_0011236a;
LAB_00112354:
  iVar10 = 0x43;
LAB_0011236a:
  type = 0xfffffffa;
  level = 1;
  msg = "Corrupt compressed image.";
  file = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
  ;
  goto LAB_001122b5;
LAB_0011229e:
  iVar10 = 0x43;
LAB_001122a1:
  msg = "Corrupt compressed image.";
  file = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
  ;
  type = 0xfffffffa;
  level = 1;
LAB_001122b5:
  icetRaiseDiagnostic(msg,type,level,file,iVar10);
LAB_001122ba:
  icetTimingBlendEnd();
  return;
}

Assistant:

void icetCompressedSubComposite(IceTImage destBuffer,
                                IceTSizeType offset,
                                const IceTSparseImage srcBuffer,
                                int srcOnTop)
{
    icetTimingBlendBegin();

    if (srcOnTop) {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_OVER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_OVER_FLOAT
#include "decompress_func_body.h"
    } else {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_UNDER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_UNDER_FLOAT
#include "decompress_func_body.h"
    }

    icetTimingBlendEnd();
}